

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

int first_geq(uint *I_start,int m,int h)

{
  int iVar1;
  int i;
  int R;
  int L;
  int h_local;
  int m_local;
  uint *I_start_local;
  
  L = 0;
  R = m;
  while( true ) {
    while( true ) {
      if (R < L) {
        return L;
      }
      iVar1 = (L + R) / 2;
      if ((uint)h <= I_start[iVar1]) break;
      L = iVar1 + 1;
    }
    if (I_start[iVar1] <= (uint)h) break;
    R = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

int first_geq(unsigned int* I_start, int m, int h)
{
    int L = 0, R = m;
    int i;
    while(L<=R)
    {
        i = (L+R) / 2;
        if(I_start[i]<h)
            L = i + 1;
        else if(I_start[i]>h)
            R = i - 1;
        else
            return i;
    }
    return L;  
}